

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

float __thiscall
ltc::evaluate(ltc *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  float fVar1;
  uint uVar2;
  ostream *poVar3;
  logic_error *plVar4;
  float *pfVar5;
  float local_11c;
  float result;
  undefined1 local_114 [4];
  float d;
  float local_f0;
  float jacobian;
  undefined4 local_dc;
  undefined1 auStack_d8 [4];
  float MIN_TRANSFORMED_LENGTH;
  float local_d0;
  mat3 local_c4;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_a0;
  float local_94;
  undefined1 auStack_90 [4];
  float len;
  float local_88;
  undefined1 local_80 [20];
  mat3 local_6c;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_48;
  undefined1 local_38 [8];
  vec3 original_light_dir;
  float *probability_density_function_local;
  vec3 *view_dir_local;
  vec3 *light_dir_local;
  ltc *this_local;
  
  unique0x1000024d = probability_density_function;
  get_framed_ltc_matrix_inv(&local_6c,this);
  local_80._0_12_ = (undefined1  [12])glm::operator*(&local_6c,light_dir);
  local_48.field_0.z = (float)local_80._8_4_;
  local_48._0_8_ = local_80._0_8_;
  _auStack_90 = (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
                 )glm::normalize<3,float,(glm::precision)0,glm::vec>
                            ((vec<3,_float,_(glm::precision)0> *)&local_48.field_0);
  original_light_dir.field_0.field_0.x = local_88;
  local_38 = (undefined1  [8])_auStack_90;
  get_framed_ltc_matrix(&local_c4,this);
  _auStack_d8 = (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
                 )glm::operator*(&local_c4,(row_type *)local_38);
  local_a0._0_8_ = _auStack_d8;
  local_a0.field_0.z = local_d0;
  local_94 = glm::length<3,float,(glm::precision)0,glm::vec>
                       ((vec<3,_float,_(glm::precision)0> *)&local_a0.field_0);
  local_dc = 0x322bcc77;
  if (local_94 < 1e-08) {
    poVar3 = log_error();
    poVar3 = std::operator<<(poVar3,
                             "Transformed light direction to original space is degenerated (with length = 0)."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"Transformed light direction is degenerated");
    __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  get_framed_ltc_matrix((mat3 *)local_114,this);
  local_f0 = glm::determinant<3,3,float,(glm::precision)0,glm::mat>
                       ((mat<3,_3,_float,_(glm::precision)0> *)local_114);
  local_f0 = local_f0 / (local_94 * local_94 * local_94);
  uVar2 = std::isnan((double)(ulong)(uint)local_f0);
  if ((uVar2 & 1) == 0) {
    local_11c = 0.0;
    pfVar5 = std::max<float>(&local_11c,(float *)&original_light_dir);
    local_f0 = (*pfVar5 / 3.1415927) / local_f0;
    fVar1 = this->_amplitude;
    *stack0xffffffffffffffd8 = local_f0;
    return fVar1 * local_f0;
  }
  poVar3 = log_error();
  poVar3 = std::operator<<(poVar3,"LTC Jacobian is NaN. Aborting.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"Jacobian is NaN");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

float ltc::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  // here 'original' means original clamped cosine distribution 'space'
  glm::vec3 original_light_dir = glm::normalize(get_framed_ltc_matrix_inv() * light_dir);
  auto len = glm::length(get_framed_ltc_matrix() * original_light_dir);

  const float MIN_TRANSFORMED_LENGTH = 0.00000001f;
  if (len < MIN_TRANSFORMED_LENGTH)
  {
    log_error() << "Transformed light direction to original space is degenerated (with length = 0)." << std::endl;
    throw std::logic_error("Transformed light direction is degenerated");
  }

  auto jacobian = glm::determinant(get_framed_ltc_matrix()) / (len * len * len);

  if (std::isnan(jacobian))
  {
    log_error() << "LTC Jacobian is NaN. Aborting." << std::endl;
    throw std::logic_error("Jacobian is NaN");
  }

  float d = std::max(0.0f, original_light_dir.z) / pi / jacobian;
  float result = _amplitude * d;

  probability_density_function = d;

  return result;
}